

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_p.h
# Opt level: O0

void qt_rectfill<unsigned_char>
               (uchar *dest,uchar value,int x,int y,int width,int height,qsizetype stride)

{
  int in_R8D;
  int in_R9D;
  ulong in_stack_00000008;
  int j;
  char *d;
  quint8 in_stack_ffffffffffffffcf;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar1;
  
  if ((in_stack_00000008 & 0xffffffff) == (long)in_R8D) {
    qt_memfill<unsigned_char>
              ((quint8 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcf,0xb7a12b);
  }
  else {
    for (iVar1 = 0; iVar1 < in_R9D; iVar1 = iVar1 + 1) {
      qt_memfill<unsigned_char>
                ((quint8 *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcf,
                 0xb7a15f);
    }
  }
  return;
}

Assistant:

static
inline void qt_rectfill(T *dest, T value,
                        int x, int y, int width, int height, qsizetype stride)
{
    char *d = reinterpret_cast<char*>(dest + x) + y * stride;
    if (uint(stride) == (width * sizeof(T))) {
        qt_memfill(reinterpret_cast<T*>(d), value, qsizetype(width) * height);
    } else {
        for (int j = 0; j < height; ++j) {
            dest = reinterpret_cast<T*>(d);
            qt_memfill(dest, value, width);
            d += stride;
        }
    }
}